

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

bool am_remove_match_command(Am_Object *match_command)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  void *this;
  Am_Method_Wrapper *value;
  undefined1 local_38 [8];
  Am_Object_Method do_method;
  Am_Object local_18;
  Am_Object installed_on_command;
  Am_Object *match_command_local;
  
  installed_on_command.data = (Am_Object_Data *)match_command;
  pAVar1 = Am_Object::Get(match_command,Am_INSTALLED_ON_COMMAND,0);
  Am_Object::Am_Object(&local_18,pAVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"*Removing match_command ");
  poVar2 = operator<<(poVar2,(Am_Object *)installed_on_command.data);
  poVar2 = std::operator<<(poVar2," for ");
  poVar2 = operator<<(poVar2,&local_18);
  this = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  pAVar1 = Am_Object::Get(&local_18,Am_REAL_DO_METHOD,3);
  Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_38,pAVar1);
  value = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_((Am_Object_Method *)local_38);
  Am_Object::Set(&local_18,0xca,value,0);
  Am_Object::Set(&local_18,Am_INVOKE_MATCH_COMMAND,0,0);
  Am_Object::~Am_Object(&local_18);
  return true;
}

Assistant:

bool
am_remove_match_command(Am_Object &match_command)
{
  Am_Object installed_on_command = match_command.Get(Am_INSTALLED_ON_COMMAND);
  std::cout << "*Removing match_command " << match_command << " for "
            << installed_on_command << std::endl
            << std::flush;
  Am_Object_Method do_method =
      installed_on_command.Get(Am_REAL_DO_METHOD, Am_RETURN_ZERO_ON_ERROR);
  installed_on_command.Set(Am_DO_METHOD, do_method);
  installed_on_command.Set(Am_INVOKE_MATCH_COMMAND, (0L));
  return true;
}